

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::ConfigINI::to_config
          (string *__return_storage_ptr__,ConfigINI *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  App *pAVar1;
  size_type sVar2;
  size_type sVar3;
  pointer puVar4;
  pointer pcVar5;
  bool bVar6;
  string *psVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  long lVar12;
  long *plVar13;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  long *plVar18;
  pointer ppAVar19;
  char cVar20;
  undefined7 in_register_00000081;
  ulong uVar21;
  string value;
  string name;
  stringstream out;
  undefined1 local_308 [24];
  long lStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Any_data local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined4 local_29c;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_298;
  pointer local_280;
  string *local_278;
  string local_270;
  long *local_250;
  long local_248;
  long local_240;
  undefined4 uStack_238;
  undefined4 uStack_234;
  string local_230;
  App *local_210;
  string *local_208;
  ConfigINI *local_200;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_29c = (undefined4)CONCAT71(in_register_00000081,write_description);
  local_278 = prefix;
  local_200 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1e8 = (code *)0x0;
  uStack_1e0 = 0;
  App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_298,
                   app,(function<bool_(const_CLI::Option_*)> *)&local_1f8);
  local_208 = __return_storage_ptr__;
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)((_Any_data *)&local_1f8,(_Any_data *)&local_1f8,__destroy_functor);
  }
  local_280 = local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar19 = local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_210 = app;
    do {
      pAVar1 = *ppAVar19;
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&(pAVar1->description_).field_2 + 8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2c8,__x);
      if (local_2c8._M_unused._M_object == (void *)local_2c8._8_8_) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2c8);
      }
      else {
        cVar20 = (pAVar1->name_).field_2._M_local_buf[0xb];
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2c8);
        if (cVar20 == '\x01') {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_308,__x);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2c8,local_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_308._0_8_);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_308);
          local_308._0_8_ = local_308 + 0x10;
          local_308._8_8_ = (pointer)0x0;
          local_308._16_8_ = local_308._16_8_ & 0xffffffffffffff00;
          sVar2 = (pAVar1->group_).field_2._M_allocated_capacity;
          sVar3 = *(size_type *)((long)&(pAVar1->group_).field_2 + 8);
          if (*(int *)((long)&(pAVar1->failure_message_).super__Function_base._M_functor + 0xc) == 0
             ) {
            pcVar15 = "true";
            if (sVar3 - sVar2 == 0x20) {
LAB_00174873:
              ::std::__cxx11::string::_M_replace((ulong)local_308,0,(char *)0x0,(ulong)pcVar15);
            }
            else {
              uVar21 = (long)(sVar3 - sVar2) >> 5;
              if (uVar21 < 2) {
                pcVar15 = "false";
                if (default_also && sVar3 == sVar2) goto LAB_00174873;
              }
              else {
                cVar20 = '\x01';
                if (9 < uVar21) {
                  uVar16 = uVar21;
                  cVar8 = '\x04';
                  do {
                    cVar20 = cVar8;
                    if (uVar16 < 100) {
                      cVar20 = cVar20 + -2;
                      goto LAB_001749b0;
                    }
                    if (uVar16 < 1000) {
                      cVar20 = cVar20 + -1;
                      goto LAB_001749b0;
                    }
                    if (uVar16 < 10000) goto LAB_001749b0;
                    bVar6 = 99999 < uVar16;
                    uVar16 = uVar16 / 10000;
                    cVar8 = cVar20 + '\x04';
                  } while (bVar6);
                  cVar20 = cVar20 + '\x01';
                }
LAB_001749b0:
                local_2e8._M_allocated_capacity = (size_type)&local_2d8;
                ::std::__cxx11::string::_M_construct((ulong)&local_2e8,cVar20);
                ::std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_2e8._M_allocated_capacity,local_2e8._8_4_,uVar21);
                ::std::__cxx11::string::operator=
                          ((string *)local_308,(string *)local_2e8._M_local_buf);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8._M_allocated_capacity != &local_2d8) {
LAB_001749ee:
                  operator_delete((void *)local_2e8._M_allocated_capacity,
                                  local_2d8._M_allocated_capacity + 1);
                }
              }
            }
          }
          else if (sVar3 == sVar2) {
            if (default_also) {
              sVar2 = (pAVar1->footer_)._M_string_length;
              local_2e8._M_allocated_capacity = (size_type)&local_2d8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2e8,sVar2,
                         (pAVar1->footer_).field_2._M_allocated_capacity + sVar2);
              lVar12 = CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_allocated_capacity != &local_2d8) {
                operator_delete((void *)local_2e8._M_allocated_capacity,
                                local_2d8._M_allocated_capacity + 1);
              }
              if (lVar12 != 0) {
                sVar2 = (pAVar1->footer_)._M_string_length;
                local_2e8._M_allocated_capacity = (size_type)&local_2d8;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2e8,sVar2,
                           (pAVar1->footer_).field_2._M_allocated_capacity + sVar2);
                ::std::__cxx11::string::operator=
                          ((string *)local_308,(string *)local_2e8._M_local_buf);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8._M_allocated_capacity != &local_2d8) goto LAB_001749ee;
              }
            }
          }
          else {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_1d0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&(pAVar1->group_).field_2);
            detail::ini_join((string *)&local_2e8,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_1d0);
            ::std::__cxx11::string::operator=((string *)local_308,(string *)local_2e8._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e8._M_allocated_capacity != &local_2d8) {
              operator_delete((void *)local_2e8._M_allocated_capacity,
                              local_2d8._M_allocated_capacity + 1);
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1d0);
          }
          if ((pointer)local_308._8_8_ != (pointer)0x0) {
            if (((byte)local_29c != '\0') &&
               ((pAVar1->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0)) {
              iVar9 = ::std::ostream::tellp();
              if (iVar9 != 0) {
                ::std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
                ::std::ostream::put((char)local_1a8);
                ::std::ostream::flush();
              }
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"; ","");
              local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
              puVar4 = (pAVar1->options_).
                       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_270,puVar4,
                         (long)&(((pAVar1->options_).
                                  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                                .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl +
                         (long)puVar4);
              detail::fix_newlines((string *)&local_2e8,&local_230,&local_270);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_2e8._M_allocated_capacity,
                                   CONCAT44(local_2e8._12_4_,local_2e8._8_4_));
              ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              ::std::ostream::put((char)poVar11);
              ::std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_allocated_capacity != &local_2d8) {
                operator_delete((void *)local_2e8._M_allocated_capacity,
                                local_2d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p != &local_270.field_2) {
                operator_delete(local_270._M_dataplus._M_p,
                                local_270.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
            }
            iVar9 = *(int *)((long)&(pAVar1->failure_message_).super__Function_base._M_functor + 0xc
                            );
            iVar10 = *(int *)&(pAVar1->failure_message_).super__Function_base._M_manager;
            uVar14 = 0xffffffff;
            if ((*(int *)((long)&(pAVar1->name_).field_2 + 0xc) == 0) && (uVar14 = 1, iVar10 < 0)) {
              uVar14 = iVar9 >> 0x1f | 1;
            }
            iVar10 = iVar10 * iVar9;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            if (iVar9 * uVar14 == 1) {
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_2c8._M_unused._0_8_,
                                   local_2c8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"=",1);
              cVar20 = *(char *)&((_Alloc_hider *)local_308._0_8_)->_M_p;
              if (((cVar20 != '\'') && (cVar20 != '\"')) ||
                 (cVar20 != ((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_308._0_8_ + -0x20))->field_2)._M_local_buf + 0xf)
                            [local_308._8_8_])) {
                cVar20 = (char)local_308;
                ::std::__cxx11::string::find(cVar20,0x22);
                ::std::__cxx11::string::find(cVar20,0x27);
                lVar12 = ::std::__cxx11::string::find(cVar20,0x20);
                if (lVar12 != -1) {
                  ::std::__cxx11::string::insert((ulong)local_308,0,'\x01');
                  ::std::__cxx11::string::_M_replace_aux((ulong)local_308,local_308._8_8_,0,'\x01');
                }
              }
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_308._0_8_,local_308._8_8_);
              ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            }
            else {
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_2c8._M_unused._0_8_,
                                   local_2c8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"=",1);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_308._0_8_,local_308._8_8_);
              ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            }
            ::std::ostream::put((char)poVar11);
            ::std::ostream::flush();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_308 + 0x10)) {
            operator_delete((void *)local_308._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_308._16_8_)->_M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_unused._0_8_ != &local_2b8) {
            operator_delete(local_2c8._M_unused._M_object,local_2b8._M_allocated_capacity + 1);
          }
        }
      }
      ppAVar19 = ppAVar19 + 1;
      app = local_210;
    } while (ppAVar19 != local_280);
  }
  if (local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_2b8._M_allocated_capacity = 0;
  local_2b8._8_8_ = 0;
  local_2c8._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_2c8._8_8_ = 0;
  App::get_subcommands(&local_298,app,(function<bool_(const_CLI::App_*)> *)&local_2c8);
  if ((code *)local_2b8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_2b8._M_allocated_capacity)(&local_2c8,&local_2c8,3);
  }
  local_280 = local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar21 = (ulong)(byte)local_29c;
    ppAVar19 = local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar1 = *ppAVar19;
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      pcVar5 = (pAVar1->name_)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e8,pcVar5,pcVar5 + (pAVar1->name_)._M_string_length);
      plVar13 = (long *)::std::__cxx11::string::replace
                                  ((ulong)&local_2e8,0,(char *)0x0,
                                   (ulong)(local_278->_M_dataplus)._M_p);
      local_308._0_8_ = local_308 + 0x10;
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar13 + 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar13 == pbVar17)
      {
        local_308._16_8_ = (pbVar17->_M_dataplus)._M_p;
        lStack_2f0 = plVar13[3];
      }
      else {
        local_308._16_8_ = (pbVar17->_M_dataplus)._M_p;
        local_308._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar13;
      }
      local_308._8_8_ = plVar13[1];
      *plVar13 = (long)pbVar17;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)::std::__cxx11::string::append(local_308);
      plVar18 = plVar13 + 2;
      if ((long *)*plVar13 == plVar18) {
        local_240 = *plVar18;
        uStack_238 = (undefined4)plVar13[3];
        uStack_234 = *(undefined4 *)((long)plVar13 + 0x1c);
        local_250 = &local_240;
      }
      else {
        local_240 = *plVar18;
        local_250 = (long *)*plVar13;
      }
      local_248 = plVar13[1];
      *plVar13 = (long)plVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      (**(local_200->super_Config)._vptr_Config)
                (&local_2c8,local_200,pAVar1,(ulong)default_also,uVar21,&local_250);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_unused._0_8_ != &local_2b8) {
        operator_delete(local_2c8._M_unused._M_object,(ulong)(local_2b8._M_allocated_capacity + 1));
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,local_240 + 1);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_308 + 0x10)) {
        operator_delete((void *)local_308._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_308._16_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_allocated_capacity != &local_2d8) {
        operator_delete((void *)local_2e8._M_allocated_capacity,local_2d8._M_allocated_capacity + 1)
        ;
      }
      ppAVar19 = ppAVar19 + 1;
    } while (ppAVar19 != local_280);
  }
  if (local_298.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  psVar7 = local_208;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar7;
}

Assistant:

inline std::string
ConfigINI::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    for(const Option *opt : app->get_options({})) {

        // Only process option with a long-name and configurable
        if(!opt->get_lnames().empty() && opt->get_configurable()) {
            std::string name = prefix + opt->get_lnames()[0];
            std::string value;

            // Non-flags
            if(opt->get_type_size() != 0) {

                // If the option was found on command line
                if(opt->count() > 0)
                    value = detail::ini_join(opt->results());

                // If the option has a default and is requested by optional argument
                else if(default_also && !opt->get_defaultval().empty())
                    value = opt->get_defaultval();
                // Flag, one passed
            } else if(opt->count() == 1) {
                value = "true";

                // Flag, multiple passed
            } else if(opt->count() > 1) {
                value = std::to_string(opt->count());

                // Flag, not present
            } else if(opt->count() == 0 && default_also) {
                value = "false";
            }

            if(!value.empty()) {
                if(write_description && opt->has_description()) {
                    if(static_cast<int>(out.tellp()) != 0) {
                        out << std::endl;
                    }
                    out << "; " << detail::fix_newlines("; ", opt->get_description()) << std::endl;
                }

                // Don't try to quote anything that is not size 1
                if(opt->get_items_expected() != 1)
                    out << name << "=" << value << std::endl;
                else
                    out << name << "=" << detail::add_quotes_if_needed(value) << std::endl;
            }
        }
    }

    for(const App *subcom : app->get_subcommands({}))
        out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");

    return out.str();
}